

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hpp
# Opt level: O3

void yactfr::internal::Vm::
     _setDataElemFromInstr<yactfr::VariantWithSignedIntegerSelectorBeginningElement>
               (VariantWithSignedIntegerSelectorBeginningElement *elem,Instr *instr)

{
  DataType *pDVar1;
  bool bVar2;
  
  bVar2 = Instr::isBeginReadData(instr);
  if ((!bVar2) &&
     ((0x21 < (ulong)instr->_theKind || ((0x3f7e00000U >> ((ulong)instr->_theKind & 0x3f) & 1) == 0)
      ))) {
    __assert_fail("instr.isBeginReadData() || instr.isEndReadData()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/vm.hpp"
                  ,0x592,
                  "static void yactfr::internal::Vm::_setDataElemFromInstr(ElemT &, const Instr &) [ElemT = yactfr::VariantWithSignedIntegerSelectorBeginningElement]"
                 );
  }
  pDVar1 = *(DataType **)&instr[1]._theKind;
  (elem->
  super_VariantWithIntegerSelectorBeginningElement<yactfr::VariantWithSignedIntegerSelectorType,_long_long,_(yactfr::Element::Kind)268468226>
  ).super_VariantBeginningElement.super_DataElement._structMemberType =
       (StructureMemberType *)instr[1]._vptr_Instr;
  (elem->
  super_VariantWithIntegerSelectorBeginningElement<yactfr::VariantWithSignedIntegerSelectorType,_long_long,_(yactfr::Element::Kind)268468226>
  ).super_VariantBeginningElement.super_DataElement._dt = pDVar1;
  return;
}

Assistant:

static void _setDataElemFromInstr(ElemT& elem, const Instr& instr) noexcept
    {
        assert(instr.isBeginReadData() || instr.isEndReadData());

        auto& readDataInstr = static_cast<const ReadDataInstr&>(instr);

        elem._dt = &readDataInstr.dt();
        elem._structMemberType = readDataInstr.memberType();
    }